

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.h
# Opt level: O1

void __thiscall Node::Node(Node *this,int TypeValue,string *xTextValue,int Include,int Line)

{
  (this->TextValue)._M_dataplus._M_p = (pointer)&(this->TextValue).field_2;
  (this->TextValue)._M_string_length = 0;
  (this->TextValue).field_2._M_local_buf[0] = '\0';
  this->Type = TypeValue;
  std::__cxx11::string::_M_assign((string *)&this->TextValue);
  this->Block[1] = (Node *)0x0;
  this->Block[2] = (Node *)0x0;
  this->Tree[4] = (Node *)0x0;
  this->Block[0] = (Node *)0x0;
  this->Tree[2] = (Node *)0x0;
  this->Tree[3] = (Node *)0x0;
  this->Tree[0] = (Node *)0x0;
  this->Tree[1] = (Node *)0x0;
  this->FromInclude = Include;
  this->lineno = Line;
  return;
}

Assistant:

Node(
		int TypeValue = 0,		/**< Node Type */
		std::string xTextValue = "",	/**< Textual value of node */
		int Include = 0,		/**< Is node from an include file */
		int Line = 0			/**< Source line number */
		)
	{ Type = TypeValue; TextValue = xTextValue;
	  Tree[0] = 0; Tree[1] = 0; Tree[2] = 0;
	  Tree[3] = 0; Tree[4] = 0; Block[0] = 0;
	  Block[1] = 0; Block[2] = 0;
	  FromInclude = Include; lineno = Line; }